

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O3

int anon_unknown.dwarf_43935::xOpen
              (sqlite3_vfs *svfs,sqlite3_filename zName,sqlite3_file *sfile,int flags,int *pOutFlags
              )

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  sqlite3_io_methods *this;
  char cVar4;
  storage_type_conflict *psVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sfile->pMethods = (sqlite3_io_methods *)0x0;
  sfile[1].pMethods = (sqlite3_io_methods *)0x0;
  iVar3 = 3;
  if (-1 < (char)(byte)flags && zName != (sqlite3_filename)0x0) {
    cVar2 = '\x01';
    if ((flags & 0xfU) != 1) {
      cVar4 = ((~flags & 0x14U) == 0) * '@';
      cVar2 = cVar4 + '\x03';
      if ((flags & 2U) == 0) {
        cVar2 = cVar4;
      }
    }
    sfile->pMethods = (sqlite3_io_methods *)&svfs[1].mxPathname;
    this = (sqlite3_io_methods *)operator_new(0x18);
    psVar5 = (storage_type_conflict *)0xffffffffffffffff;
    do {
      pcVar1 = zName + 1 + (long)psVar5;
      psVar5 = psVar5 + 1;
    } while (*pcVar1 != '\0');
    QVar6.m_data = psVar5;
    QVar6.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar6);
    QFile::QFile((QFile *)this,&local_50);
    *(undefined ***)this = &PTR_metaObject_00239e70;
    *(byte *)&this->xRead = (byte)flags >> 3 & 1;
    sfile[1].pMethods = this;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    cVar2 = (**(code **)(*(long *)sfile[1].pMethods + 0x68))(sfile[1].pMethods,cVar2);
    iVar3 = 0xe;
    if (cVar2 != '\0') {
      iVar3 = 0;
      if (pOutFlags != (int *)0x0) {
        *pOutFlags = flags;
        iVar3 = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int xOpen(sqlite3_vfs *svfs, sqlite3_filename zName, sqlite3_file *sfile,
          int flags, int *pOutFlags)
{
    auto vfs = static_cast<Vfs *>(svfs);
    auto file = static_cast<File *>(sfile);
    memset(file, 0, sizeof(File));
    QIODeviceBase::OpenMode mode = QIODeviceBase::NotOpen;
    if (!zName || (flags & SQLITE_OPEN_MEMORY))
        return SQLITE_PERM;
    if ((flags & SQLITE_OPEN_READONLY) &&
        !(flags & SQLITE_OPEN_READWRITE) &&
        !(flags & SQLITE_OPEN_CREATE) &&
        !(flags & SQLITE_OPEN_DELETEONCLOSE)) {
        mode |= QIODeviceBase::OpenModeFlag::ReadOnly;
    } else {
        /*
            ** ^The [SQLITE_OPEN_EXCLUSIVE] flag is always used in conjunction
            ** with the [SQLITE_OPEN_CREATE] flag, which are both directly
            ** analogous to the O_EXCL and O_CREAT flags of the POSIX open()
            ** API.  The SQLITE_OPEN_EXCLUSIVE flag, when paired with the
            ** SQLITE_OPEN_CREATE, is used to indicate that file should always
            ** be created, and that it is an error if it already exists.
            ** It is <i>not</i> used to indicate the file should be opened
            ** for exclusive access.
         */
        if ((flags & SQLITE_OPEN_CREATE) && (flags & SQLITE_OPEN_EXCLUSIVE))
            mode |= QIODeviceBase::OpenModeFlag::NewOnly;

        if (flags & SQLITE_OPEN_READWRITE)
            mode |= QIODeviceBase::OpenModeFlag::ReadWrite;
    }

    file->pMethods = &vfs->ioMethods;
    file->pFile = new File::QtFile(QString::fromUtf8(zName), bool(flags & SQLITE_OPEN_DELETEONCLOSE));
    if (!file->pFile->open(mode))
        return SQLITE_CANTOPEN;
    if (pOutFlags)
        *pOutFlags = flags;

    return SQLITE_OK;
}